

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O1

void __thiscall
soul::SourceCodeUtilities::findASTObjectAt(soul::AST::ASTObject&,soul::CodeLocation)::
FindLocationVisitor::visitObject(soul::AST::ASTObject__(void *this,ASTObject *o)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  ASTVisitor::visitObject((ASTVisitor *)this,o);
  pcVar1 = *(char **)((long)this + 8);
  pcVar2 = (o->context).location.location.data;
  lVar3 = (long)pcVar1 - (long)pcVar2;
  if ((pcVar1 == pcVar2) ||
     (((0 < lVar3 && (*(long *)((long)this + 0x10) != 0)) &&
      (lVar3 < (long)pcVar1 - *(long *)(*(long *)((long)this + 0x10) + 0x18))))) {
    *(ASTObject **)((long)this + 0x10) = o;
  }
  return;
}

Assistant:

void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto distance = target - o.context.location.location.getAddress();

            if (distance == 0
                 || (distance > 0
                      && result != nullptr
                      && distance < target - result->context.location.location.getAddress()))
                result = o;
        }